

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O0

size_t al_ustr_encode_utf16(ALLEGRO_USTR *us,uint16_t *s,size_t n)

{
  long lVar1;
  ulong in_RDX;
  long in_RSI;
  int32_t c;
  size_t sz;
  uint16_t encoded [2];
  size_t i;
  int pos;
  undefined4 in_stack_ffffffffffffffc0;
  int32_t in_stack_ffffffffffffffc4;
  ALLEGRO_USTR *in_stack_ffffffffffffffc8;
  uint16_t local_2c;
  undefined2 local_2a;
  long local_28;
  undefined4 local_1c;
  ulong local_18;
  long local_10;
  
  local_1c = 0;
  local_28 = 0;
  lVar1 = local_28;
  local_18 = in_RDX;
  local_10 = in_RSI;
  while( true ) {
    local_28 = lVar1;
    memset(&local_2c,0,4);
    in_stack_ffffffffffffffc4 =
         al_ustr_get_next(in_stack_ffffffffffffffc8,
                          (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    if ((in_stack_ffffffffffffffc4 < 0) ||
       (in_stack_ffffffffffffffc8 =
             (ALLEGRO_USTR *)al_utf16_encode(&local_2c,in_stack_ffffffffffffffc4),
       local_18 - 2 < (ulong)((long)&in_stack_ffffffffffffffc8->mlen + local_28 * 2))) break;
    *(uint16_t *)(local_10 + local_28 * 2) = local_2c;
    lVar1 = local_28 + 1;
    if (in_stack_ffffffffffffffc8 == (ALLEGRO_USTR *)0x4) {
      *(undefined2 *)(local_10 + (local_28 + 1) * 2) = local_2a;
      lVar1 = local_28 + 2;
    }
  }
  if (local_28 * 2 + 1U < local_18) {
    *(undefined2 *)(local_10 + local_28 * 2) = 0;
    local_28 = local_28 + 1;
  }
  return local_28 << 1;
}

Assistant:

size_t al_ustr_encode_utf16(const ALLEGRO_USTR *us, uint16_t *s,
   size_t n)
{
   int pos = 0;
   size_t i = 0;
   while (1) {
      /* Used to hold one encoded UTF-16 character. */
      uint16_t encoded[2] = {0, 0};
      size_t sz;
      int32_t c = al_ustr_get_next(us, &pos);
      if (c < 0)
         break;
      sz = al_utf16_encode(encoded, c);
      /* Need two bytes for terminating 0. */
      if (i * 2 + sz > n - 2)
         break;
      s[i++] = encoded[0];
      if (sz == 4)
         s[i++] = encoded[1];
   }
   /* Append terminating 0 - al_ustr_get_next withheld it. */
   if (i * 2 + 1 < n)
      s[i++] = 0;

   return i * 2;
}